

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_MinipointCounterTest_ChooseHighestPointsWait_AnotherHandOrder_Test::testBody
          (TEST_MinipointCounterTest_ChooseHighestPointsWait_AnotherHandOrder_Test *this)

{
  int iVar1;
  int iVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  MinipointCounter *this_00;
  SimpleString local_38;
  SimpleString local_30;
  TestTerminatorWithoutExceptions local_28;
  
  TEST_GROUP_CppUTestGroupMinipointCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest,SouthWind);
  TEST_GROUP_CppUTestGroupMinipointCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest,ThreeOfCharacters,false);
  TEST_GROUP_CppUTestGroupMinipointCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest,OneOfCharacters,false);
  TEST_GROUP_CppUTestGroupMinipointCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest,OneOfCircles,true);
  TEST_GROUP_CppUTestGroupMinipointCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest,OneOfBamboos,true);
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.last_tile = ThreeOfCharacters;
  mahjong::WiningState::winByDiscard
            (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).s,
             (WinByDiscardSituation)0x0);
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).m;
  iVar1 = mahjong::MinipointCounter::total(this_00,false);
  if (iVar1 == 0x16) {
    pUVar3 = UtestShell::getCurrent();
    local_38.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
               ,0xc0,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_38);
  }
  else {
    iVar1 = mahjong::MinipointCounter::total(this_00,false);
    iVar2 = mahjong::MinipointCounter::total(this_00,false);
    if (iVar1 != iVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
                 ,0xc0);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_38);
    pcVar4 = SimpleString::asCharString(&local_38);
    mahjong::MinipointCounter::total(this_00,false);
    StringFrom((int)&local_30);
    pcVar5 = SimpleString::asCharString(&local_30);
    local_28.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
               ,0xc0,&local_28);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_28);
    SimpleString::~SimpleString(&local_30);
    SimpleString::~SimpleString(&local_38);
  }
  return;
}

Assistant:

TEST(MinipointCounterTest, ChooseHighestPointsWait_AnotherHandOrder)
{
	addPair(Tile::SouthWind);
	addSequence(Tile::ThreeOfCharacters, false);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::OneOfCircles, true);
	addSequence(Tile::OneOfBamboos, true);

	h.last_tile = Tile::ThreeOfCharacters;
	s.winByDiscard();
	CHECK_EQUAL(22, m.total(false));
}